

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bingo.hpp
# Opt level: O0

void __thiscall BingoGenerator::init_tree_cutting_goals(BingoGenerator *this)

{
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  int local_14;
  BingoGenerator *pBStack_10;
  int i;
  BingoGenerator *this_local;
  
  pBStack_10 = this;
  for (local_14 = 4; local_14 < 0xd; local_14 = local_14 + 1) {
    std::__cxx11::to_string(&local_78,local_14);
    std::operator+(&local_58,"Cut ",&local_78);
    std::operator+(&local_38,&local_58," Sacred Trees using Axe Magic");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &this->_tree_cutting_goals,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_78);
  }
  vectools::shuffle<std::__cxx11::string>(&this->_tree_cutting_goals,&this->_rng);
  return;
}

Assistant:

void init_tree_cutting_goals()
    {
        for(int i=4 ; i <= 12 ; ++i)
            _tree_cutting_goals.emplace_back("Cut " + std::to_string(i) + " Sacred Trees using Axe Magic");
        vectools::shuffle(_tree_cutting_goals, _rng);
    }